

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void __thiscall asl::Random::seed(Random *this,ULong s)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    this->_state[lVar1] =
         (s ^ 0x7a12345fb678ce93) << ((char)lVar1 + 2U & 0x3f) ^ s ^ 0x7a12345fb678ce93;
  }
  iVar2 = 6;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    get(this);
  }
  return;
}

Assistant:

void Random::seed(ULong s)
{
	s ^= 0x7a12345fb678ce93ull;
	for (int i = 0; i < _size; i++)
		_state[i] = s ^ (s << (i + 2));

	for (int i = 0; i < 6; i++)
		get();
}